

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniFB_GL.c
# Opt level: O3

void init_GL(SWindowData *window_data)

{
  void *pvVar1;
  
  pvVar1 = window_data->specific;
  glViewport(0,0,window_data->window_width,window_data->window_height);
  glMatrixMode(0x1701);
  glLoadIdentity();
  glOrtho(0,(double)window_data->window_width,(double)window_data->window_height,0,
          0x40a0000000000000,0xc0a0000000000000);
  glMatrixMode(0x1700);
  glLoadIdentity();
  glDisable(0xb71);
  glDisable(0xb90);
  glEnable(0xde1);
  glGenTextures(1,(long)pvVar1 + 0x28);
  glBindTexture(0xde1,*(undefined4 *)((long)pvVar1 + 0x28));
  glTexParameteri(0xde1,0x2802,0x2901);
  glTexParameteri(0xde1,0x2803,0x2901);
  glTexParameteri(0xde1,0x2801,0x2600);
  glTexParameteri(0xde1,0x2800,0x2600);
  glEnableClientState(0x8074);
  glEnableClientState(0x8078);
  return;
}

Assistant:

void
init_GL(SWindowData *window_data) {
#if defined(_WIN32) || defined(WIN32)

    SWindowData_Win *window_data_ex = (SWindowData_Win *) window_data->specific;

#elif defined(linux)

    SWindowData_X11 *window_data_ex = (SWindowData_X11 *) window_data->specific;

#endif


    glViewport(0, 0, window_data->window_width, window_data->window_height);

    glMatrixMode(GL_PROJECTION);
    glLoadIdentity();
    glOrtho(0, window_data->window_width, window_data->window_height, 0, 2048, -2048);

    glMatrixMode(GL_MODELVIEW);
    glLoadIdentity();

    glDisable(GL_DEPTH_TEST);
    glDisable(GL_STENCIL_TEST);

    glEnable(GL_TEXTURE_2D);

    glGenTextures(1, &window_data_ex->text_id);
    //glActiveTexture(TEXTURE0);
    glBindTexture(GL_TEXTURE_2D, window_data_ex->text_id);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_REPEAT);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_REPEAT);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);

    glEnableClientState(GL_VERTEX_ARRAY);
    glEnableClientState(GL_TEXTURE_COORD_ARRAY);

    UseCleanUp(glDisableClientState(GL_TEXTURE_COORD_ARRAY));
    UseCleanUp(glDisableClientState(GL_VERTEX_ARRAY));
    UseCleanUp(glBindTexture(GL_TEXTURE_2D, 0));
}